

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_path_extension_equal(char *path,char *extension)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = path;
  if (extension == (char *)0x0 || path == (char *)0x0) {
    return 0;
  }
  for (; ((cVar1 = *pcVar4, pcVar3 = pcVar4, cVar1 == '/' || (cVar1 == '\\')) ||
         (pcVar3 = path, cVar1 != '\0')); pcVar4 = pcVar4 + 1) {
    path = pcVar3;
  }
  for (; (cVar1 = *path, cVar1 == '/' || (cVar1 == '\\')); path = path + 1) {
  }
  pcVar4 = (char *)0x0;
  do {
    if (cVar1 == '.') {
      path = path + 1;
      pcVar4 = path;
    }
    else if (cVar1 == '\0') {
      if (pcVar4 != (char *)0x0) {
        path = pcVar4;
      }
      iVar2 = strcasecmp(extension,path);
      return (uint)(iVar2 == 0);
    }
    cVar1 = path[1];
    path = path + 1;
  } while( true );
}

Assistant:

static ma_bool32 ma_path_extension_equal(const char* path, const char* extension)
{
    const char* ext1;
    const char* ext2;

    if (path == NULL || extension == NULL) {
        return MA_FALSE;
    }

    ext1 = extension;
    ext2 = ma_path_extension(path);

#if defined(_MSC_VER) || defined(__DMC__)
    return _stricmp(ext1, ext2) == 0;
#else
    return strcasecmp(ext1, ext2) == 0;
#endif
}